

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.c
# Opt level: O0

void memory_region_add_subregion_common
               (MemoryRegion_conflict *mr,hwaddr offset,MemoryRegion_conflict *subregion)

{
  undefined1 a [16];
  uint64_t uVar1;
  undefined8 in_stack_ffffffffffffffb8;
  MemoryRegion_conflict *subregion_local;
  hwaddr offset_local;
  MemoryRegion_conflict *mr_local;
  
  if (subregion->container == (MemoryRegion_conflict *)0x0) {
    subregion->container = mr;
    subregion->addr = offset;
    a._8_8_ = offset;
    a._0_8_ = in_stack_ffffffffffffffb8;
    uVar1 = int128_get64((Int128)a);
    subregion->end = offset + uVar1;
    memory_region_update_container_subregions(subregion);
    return;
  }
  __assert_fail("!subregion->container",
                "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/softmmu/memory.c"
                ,0x4dd,
                "void memory_region_add_subregion_common(MemoryRegion *, hwaddr, MemoryRegion *)");
}

Assistant:

static void memory_region_add_subregion_common(MemoryRegion *mr,
                                               hwaddr offset,
                                               MemoryRegion *subregion)
{
    assert(!subregion->container);
    subregion->container = mr;
    subregion->addr = offset;
    subregion->end = offset + int128_get64(subregion->size);
    memory_region_update_container_subregions(subregion);
}